

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O0

void __thiscall arangodb::velocypack::Dumper::appendInt(Dumper *this,int64_t v)

{
  ulong uVar1;
  long in_RSI;
  long in_RDI;
  long local_10;
  
  if (in_RSI == -0x8000000000000000) {
    (**(code **)(**(long **)(in_RDI + 8) + 0x18))
              (*(long **)(in_RDI + 8),"-9223372036854775808",0x14);
  }
  else {
    local_10 = in_RSI;
    if (in_RSI < 0) {
      (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),0x2d);
      local_10 = -in_RSI;
    }
    if (999999999999999999 < local_10) {
      uVar1 = (local_10 / 1000000000000000000) % 10 + 0x30;
      (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                (*(long **)(in_RDI + 8),(int)(char)uVar1,uVar1,uVar1 & 0xff);
    }
    if (99999999999999999 < local_10) {
      uVar1 = (local_10 / 100000000000000000) % 10 + 0x30;
      (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                (*(long **)(in_RDI + 8),(int)(char)uVar1,uVar1,uVar1 & 0xff);
    }
    if (9999999999999999 < local_10) {
      uVar1 = (local_10 / 10000000000000000) % 10 + 0x30;
      (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                (*(long **)(in_RDI + 8),(int)(char)uVar1,uVar1,uVar1 & 0xff);
    }
    if (999999999999999 < local_10) {
      uVar1 = (local_10 / 1000000000000000) % 10 + 0x30;
      (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                (*(long **)(in_RDI + 8),(int)(char)uVar1,uVar1,uVar1 & 0xff);
    }
    if (99999999999999 < local_10) {
      uVar1 = (local_10 / 100000000000000) % 10 + 0x30;
      (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                (*(long **)(in_RDI + 8),(int)(char)uVar1,uVar1,uVar1 & 0xff);
    }
    if (9999999999999 < local_10) {
      uVar1 = (local_10 / 10000000000000) % 10 + 0x30;
      (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                (*(long **)(in_RDI + 8),(int)(char)uVar1,uVar1,uVar1 & 0xff);
    }
    if (999999999999 < local_10) {
      uVar1 = (local_10 / 1000000000000) % 10 + 0x30;
      (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                (*(long **)(in_RDI + 8),(int)(char)uVar1,uVar1,uVar1 & 0xff);
    }
    if (99999999999 < local_10) {
      uVar1 = (local_10 / 100000000000) % 10 + 0x30;
      (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                (*(long **)(in_RDI + 8),(int)(char)uVar1,uVar1,uVar1 & 0xff);
    }
    if (9999999999 < local_10) {
      uVar1 = (local_10 / 10000000000) % 10 + 0x30;
      (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                (*(long **)(in_RDI + 8),(int)(char)uVar1,uVar1,uVar1 & 0xff);
    }
    if (999999999 < local_10) {
      uVar1 = (local_10 / 1000000000) % 10 + 0x30;
      (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                (*(long **)(in_RDI + 8),(int)(char)uVar1,uVar1,uVar1 & 0xff);
    }
    if (99999999 < local_10) {
      uVar1 = (local_10 / 100000000) % 10 + 0x30;
      (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                (*(long **)(in_RDI + 8),(int)(char)uVar1,uVar1,uVar1 & 0xff);
    }
    if (9999999 < local_10) {
      uVar1 = (local_10 / 10000000) % 10 + 0x30;
      (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                (*(long **)(in_RDI + 8),(int)(char)uVar1,uVar1,uVar1 & 0xff);
    }
    if (999999 < local_10) {
      uVar1 = (local_10 / 1000000) % 10 + 0x30;
      (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                (*(long **)(in_RDI + 8),(int)(char)uVar1,uVar1,uVar1 & 0xff);
    }
    if (99999 < local_10) {
      uVar1 = (local_10 / 100000) % 10 + 0x30;
      (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                (*(long **)(in_RDI + 8),(int)(char)uVar1,uVar1,uVar1 & 0xff);
    }
    if (9999 < local_10) {
      uVar1 = (local_10 / 10000) % 10 + 0x30;
      (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                (*(long **)(in_RDI + 8),(int)(char)uVar1,uVar1,uVar1 & 0xff);
    }
    if (999 < local_10) {
      uVar1 = (local_10 / 1000) % 10 + 0x30;
      (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                (*(long **)(in_RDI + 8),(int)(char)uVar1,uVar1,uVar1 & 0xff);
    }
    if (99 < local_10) {
      uVar1 = (local_10 / 100) % 10 + 0x30;
      (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                (*(long **)(in_RDI + 8),(int)(char)uVar1,uVar1,uVar1 & 0xff);
    }
    if (9 < local_10) {
      uVar1 = (local_10 / 10) % 10 + 0x30;
      (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                (*(long **)(in_RDI + 8),(int)(char)uVar1,uVar1,uVar1 & 0xff);
    }
    uVar1 = local_10 % 10 + 0x30;
    (**(code **)(**(long **)(in_RDI + 8) + 0x10))
              (*(long **)(in_RDI + 8),(int)(char)uVar1,uVar1,uVar1 & 0xff);
  }
  return;
}

Assistant:

void Dumper::appendInt(int64_t v) {
  if (v == INT64_MIN) {
    _sink->append("-9223372036854775808", 20);
    return;
  }
  if (v < 0) {
    _sink->push_back('-');
    v = -v;
  }

  if (1000000000000000000LL <= v) {
    _sink->push_back('0' + (v / 1000000000000000000LL) % 10);
  }
  if (100000000000000000LL <= v) {
    _sink->push_back('0' + (v / 100000000000000000LL) % 10);
  }
  if (10000000000000000LL <= v) {
    _sink->push_back('0' + (v / 10000000000000000LL) % 10);
  }
  if (1000000000000000LL <= v) {
    _sink->push_back('0' + (v / 1000000000000000LL) % 10);
  }
  if (100000000000000LL <= v) {
    _sink->push_back('0' + (v / 100000000000000LL) % 10);
  }
  if (10000000000000LL <= v) {
    _sink->push_back('0' + (v / 10000000000000LL) % 10);
  }
  if (1000000000000LL <= v) {
    _sink->push_back('0' + (v / 1000000000000LL) % 10);
  }
  if (100000000000LL <= v) {
    _sink->push_back('0' + (v / 100000000000LL) % 10);
  }
  if (10000000000LL <= v) {
    _sink->push_back('0' + (v / 10000000000LL) % 10);
  }
  if (1000000000LL <= v) {
    _sink->push_back('0' + (v / 1000000000LL) % 10);
  }
  if (100000000LL <= v) {
    _sink->push_back('0' + (v / 100000000LL) % 10);
  }
  if (10000000LL <= v) {
    _sink->push_back('0' + (v / 10000000LL) % 10);
  }
  if (1000000LL <= v) {
    _sink->push_back('0' + (v / 1000000LL) % 10);
  }
  if (100000LL <= v) {
    _sink->push_back('0' + (v / 100000LL) % 10);
  }
  if (10000LL <= v) {
    _sink->push_back('0' + (v / 10000LL) % 10);
  }
  if (1000LL <= v) {
    _sink->push_back('0' + (v / 1000LL) % 10);
  }
  if (100LL <= v) {
    _sink->push_back('0' + (v / 100LL) % 10);
  }
  if (10LL <= v) {
    _sink->push_back('0' + (v / 10LL) % 10);
  }

  _sink->push_back('0' + (v % 10));
}